

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O0

void polynomial_mul(field_t field,polynomial_t l,polynomial_t r,polynomial_t res)

{
  field_t field_00;
  field_t field_01;
  field_element_t r_00;
  field_element_t fVar1;
  uint in_ECX;
  long in_RDX;
  field_logarithm_t *in_RSI;
  field_element_t *in_RDI;
  long in_R8;
  uint in_R9D;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint j;
  uint j_limit;
  uint i;
  uint local_4c;
  uint local_3c;
  uint local_34;
  
  memset(in_stack_00000008,0,(ulong)(in_stack_00000010 + 1));
  for (local_34 = 0; local_34 <= in_ECX; local_34 = local_34 + 1) {
    if (local_34 <= in_stack_00000010) {
      local_4c = in_R9D;
      if (in_stack_00000010 - local_34 < in_R9D) {
        local_4c = in_stack_00000010 - local_34;
      }
      for (local_3c = 0; local_3c <= local_4c; local_3c = local_3c + 1) {
        fVar1 = *(field_element_t *)((long)in_stack_00000008 + (ulong)(local_34 + local_3c));
        field_00.log = in_RSI;
        field_00.exp = in_RDI;
        r_00 = field_mul(field_00,*(field_element_t *)(in_RDX + (ulong)local_34),
                         *(field_element_t *)(in_R8 + (ulong)local_3c));
        field_01.log = in_RSI;
        field_01.exp = in_RDI;
        fVar1 = field_add(field_01,fVar1,r_00);
        *(field_element_t *)((long)in_stack_00000008 + (ulong)(local_34 + local_3c)) = fVar1;
      }
    }
  }
  return;
}

Assistant:

void polynomial_mul(field_t field, polynomial_t l, polynomial_t r, polynomial_t res) {
    // perform an element-wise multiplication of two polynomials
    memset(res.coeff, 0, sizeof(field_element_t) * (res.order + 1));
    for (unsigned int i = 0; i <= l.order; i++) {
        if (i > res.order) {
            continue;
        }
        unsigned int j_limit = (r.order > res.order - i) ? res.order - i : r.order;
        for (unsigned int j = 0; j <= j_limit; j++) {
            // e.g. alpha^5*x * alpha^37*x^2 --> alpha^42*x^3
            res.coeff[i + j] = field_add(field, res.coeff[i + j], field_mul(field, l.coeff[i], r.coeff[j]));
        }
    }
}